

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 MemBackendFree(SyMemBackend *pBackend,void *pChunk)

{
  sxu32 sVar1;
  long lVar2;
  long *plVar3;
  sxi32 in_EAX;
  sxi32 sVar4;
  
  sVar1 = pBackend->nBlock;
  if (sVar1 != 0) {
    if (pBackend->pBlocks == (SyMemBlock *)((long)pChunk + -0x10)) {
      pBackend->pBlocks = pBackend->pBlocks->pNext;
    }
    lVar2 = *(long *)((long)pChunk + -0x10);
    plVar3 = *(long **)((long)pChunk + -8);
    if (plVar3 != (long *)0x0) {
      *plVar3 = lVar2;
    }
    if (lVar2 != 0) {
      *(long **)(lVar2 + 8) = plVar3;
    }
    pBackend->nBlock = sVar1 - 1;
    sVar4 = (*pBackend->pMethods->xFree)((SyMemBlock *)((long)pChunk + -0x10));
    return sVar4;
  }
  return in_EAX;
}

Assistant:

static sxi32 MemBackendFree(SyMemBackend *pBackend, void * pChunk)
{
	SyMemBlock *pBlock;
	pBlock = (SyMemBlock *)(((char *)pChunk) - sizeof(SyMemBlock));
#if defined(UNTRUST)
	if( pBlock->nGuard != SXMEM_BACKEND_MAGIC ){
		return SXERR_CORRUPT;
	}
#endif
	/* Unlink from the list of active blocks */
	if( pBackend->nBlock > 0 ){
		/* Release the block */
#if defined(UNTRUST)
		/* Mark as stale block */
		pBlock->nGuard = 0x635B;
#endif
		MACRO_LD_REMOVE(pBackend->pBlocks, pBlock);
		pBackend->nBlock--;
		pBackend->pMethods->xFree(pBlock);
	}
	return SXRET_OK;
}